

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdge.hxx
# Opt level: O2

Unique<BrepEdge> __thiscall anurbs::BrepEdge::load(BrepEdge *this,Model *model,Json *data)

{
  vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *this_00;
  const_reference pvVar1;
  size_type sVar2;
  long lVar3;
  ulong idx;
  value_type trims;
  string key;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  Model *local_88;
  allocator<char> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  key_type local_70;
  string local_50 [32];
  
  local_88 = model;
  new_<anurbs::BrepEdge>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"trims",local_80);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_70);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_98,pvVar1);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
             *)(this->m_trims).
               super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(&local_98);
  std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
  resize(this_00,sVar2);
  lVar3 = 0;
  idx = 0;
  while( true ) {
    sVar2 = nlohmann::
            basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::size(&local_98);
    if (sVar2 <= idx) break;
    pvVar1 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&local_98,idx);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_70,pvVar1);
    std::__cxx11::string::string(local_50,(string *)&local_70);
    Model::get_lazy<anurbs::BrepTrim>((Model *)local_80,(string *)local_88);
    std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)&(((this->m_trims).
                            super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_entry).
                          super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
               + lVar3),(__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *
                        )local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    idx = idx + 1;
    lVar3 = lVar3 + 0x10;
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_98);
  return (__uniq_ptr_data<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>,_true,_true>)
         (__uniq_ptr_data<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>,_true,_true>)this;
}

Assistant:

Unique<BrepEdge> BrepEdge::load(Model& model, const Json& data)
{
    auto result = new_<BrepEdge>();

    // Read trims
    {
        const auto trims = data.at("trims");

        result->m_trims.resize(trims.size());

        for (size_t i = 0; i < trims.size(); i++) {
            const std::string key = trims[i];
            result->m_trims[i] = model.get_lazy<BrepTrim>(key);
        }
    }

    return result;
}